

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O3

void makeItem(item *x,object *y)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  typeDesc *ptVar4;
  int iVar5;
  
  uVar1 = y->cl;
  x->mode = uVar1;
  iVar3 = y->typeIndex;
  x->typeIndex = iVar3;
  iVar2 = y->lev;
  x->lev = iVar2;
  x->a = y->val;
  if ((uVar1 | 4) == 0x2c4) {
    x->typeIndex = y->retTypeIndex;
    x->r = 0x1c;
  }
  else {
    if (iVar2 == 0) {
      iVar5 = 0;
    }
    else {
      iVar5 = 0x1d;
      if (iVar2 != currentLevel) {
        mark("level");
        exit(-1);
      }
    }
    x->r = iVar5;
    if (uVar1 == 0x2c5) {
      ptVar4 = getType(iVar3);
      if (ptVar4->form == 0x322) {
        iVar3 = getReg();
        put(0x20,iVar3,x->r,x->a + 4);
        x->alr = iVar3;
        iVar3 = getReg();
        put(0x20,iVar3,x->r,x->a + 8);
        x->hs = iVar3;
        iVar3 = getReg();
        put(0x20,iVar3,x->r,x->a);
        x->mode = 0x2c1;
        x->a = 0;
        x->r = iVar3;
      }
      else {
        x->mode = 0x2c1;
      }
    }
  }
  return;
}

Assistant:

procedure 
void makeItem(struct item *x, struct object *y) {
	variable struct typeDesc *type;
	variable int r;
	r = 0; type =  NULL;
	x->mode = y->cl; x->typeIndex = y->typeIndex; x->lev = y->lev; x->a = y->val; 

	/* in case of proc or sproc, x->r is return value register */
	if ((y->cl == CLASS_PROC) || (y->cl == CLASS_SPROC)) {
		x->typeIndex = y->retTypeIndex;
		x->r = rv;
	} else {
		if (y->lev == 0) { 
			x->r = 0; 
		} elsif (y->lev == currentLevel) {
			x->r = fp;
		} else {
			mark("level");
			exit(-1);
		}
	}
	
	/* load paramater object */
	if (y->cl == CLASS_PAR) {
		type = getType(y->typeIndex);

		/* in case of array: first load length (+4) | isOnStack (+8) */
		if (type->form == FORM_ARRAY) {
			r = getReg();
			put(RISC_LDW,r,x->r,x->a + 4); 
			x->alr = r;
			r = getReg();
			put(RISC_LDW,r,x->r,x->a + 8); 
			x->hs = r;
			r = getReg();
			put(RISC_LDW,r,x->r,x->a);
			x->mode = CLASS_VAR; x->r = r; x->a = 0; 
		} else {
			x->mode = CLASS_VAR;
		}
		
	}
}